

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_ZeroFlag_Test::~PrintfTest_ZeroFlag_Test(PrintfTest_ZeroFlag_Test *this)

{
  void *in_RDI;
  
  ~PrintfTest_ZeroFlag_Test((PrintfTest_ZeroFlag_Test *)0x140728);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PrintfTest, ZeroFlag) {
  EXPECT_PRINTF("00042", "%05d", 42);
  EXPECT_PRINTF("-0042", "%05d", -42);

  EXPECT_PRINTF("00042", "%05d", 42);
  EXPECT_PRINTF("-0042", "%05d", -42);
  EXPECT_PRINTF("-004.2", "%06g", -4.2);

  EXPECT_PRINTF("+00042", "%00+6d", 42);

  // '0' flag is ignored for non-numeric types.
  EXPECT_PRINTF("0000x", "%05c", 'x');
}